

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void windowCheckValue(Parse *pParse,int reg,int eCond)

{
  int p2;
  int iVar1;
  int iVar2;
  Vdbe *p;
  int regString;
  int regZero;
  Vdbe *v;
  int eCond_local;
  int reg_local;
  Parse *pParse_local;
  
  p = sqlite3GetVdbe(pParse);
  p2 = sqlite3GetTempReg(pParse);
  sqlite3VdbeAddOp2(p,0x47,0,p2);
  if (eCond < 3) {
    iVar1 = sqlite3VdbeCurrentAddr(p);
    sqlite3VdbeAddOp2(p,0xd,reg,iVar1 + 2);
  }
  else {
    iVar1 = sqlite3GetTempReg(pParse);
    sqlite3VdbeAddOp4(p,0x75,0,iVar1,0,"",-1);
    iVar2 = sqlite3VdbeCurrentAddr(p);
    sqlite3VdbeAddOp3(p,0x39,iVar1,iVar2 + 2,reg);
    sqlite3VdbeChangeP5(p,0x53);
  }
  iVar1 = windowCheckValue::aOp[eCond];
  iVar2 = sqlite3VdbeCurrentAddr(p);
  sqlite3VdbeAddOp3(p,iVar1,p2,iVar2 + 2,reg);
  sqlite3VdbeChangeP5(p,0x43);
  sqlite3MayAbort(pParse);
  sqlite3VdbeAddOp2(p,0x46,1,2);
  sqlite3VdbeAppendP4(p,windowCheckValue::azErr[eCond],-1);
  sqlite3ReleaseTempReg(pParse,p2);
  return;
}

Assistant:

static void windowCheckValue(Parse *pParse, int reg, int eCond){
  static const char *azErr[] = {
    "frame starting offset must be a non-negative integer",
    "frame ending offset must be a non-negative integer",
    "second argument to nth_value must be a positive integer",
    "frame starting offset must be a non-negative number",
    "frame ending offset must be a non-negative number",
  };
  static int aOp[] = { OP_Ge, OP_Ge, OP_Gt, OP_Ge, OP_Ge };
  Vdbe *v = sqlite3GetVdbe(pParse);
  int regZero = sqlite3GetTempReg(pParse);
  assert( eCond>=0 && eCond<ArraySize(azErr) );
  sqlite3VdbeAddOp2(v, OP_Integer, 0, regZero);
  if( eCond>=WINDOW_STARTING_NUM ){
    int regString = sqlite3GetTempReg(pParse);
    sqlite3VdbeAddOp4(v, OP_String8, 0, regString, 0, "", P4_STATIC);
    sqlite3VdbeAddOp3(v, OP_Ge, regString, sqlite3VdbeCurrentAddr(v)+2, reg);
    sqlite3VdbeChangeP5(v, SQLITE_AFF_NUMERIC|SQLITE_JUMPIFNULL);
    VdbeCoverage(v);
    assert( eCond==3 || eCond==4 );
    VdbeCoverageIf(v, eCond==3);
    VdbeCoverageIf(v, eCond==4);
  }else{
    sqlite3VdbeAddOp2(v, OP_MustBeInt, reg, sqlite3VdbeCurrentAddr(v)+2);
    VdbeCoverage(v);
    assert( eCond==0 || eCond==1 || eCond==2 );
    VdbeCoverageIf(v, eCond==0);
    VdbeCoverageIf(v, eCond==1);
    VdbeCoverageIf(v, eCond==2);
  }
  sqlite3VdbeAddOp3(v, aOp[eCond], regZero, sqlite3VdbeCurrentAddr(v)+2, reg);
  sqlite3VdbeChangeP5(v, SQLITE_AFF_NUMERIC);
  VdbeCoverageNeverNullIf(v, eCond==0); /* NULL case captured by */
  VdbeCoverageNeverNullIf(v, eCond==1); /*   the OP_MustBeInt */
  VdbeCoverageNeverNullIf(v, eCond==2);
  VdbeCoverageNeverNullIf(v, eCond==3); /* NULL case caught by */
  VdbeCoverageNeverNullIf(v, eCond==4); /*   the OP_Ge */
  sqlite3MayAbort(pParse);
  sqlite3VdbeAddOp2(v, OP_Halt, SQLITE_ERROR, OE_Abort);
  sqlite3VdbeAppendP4(v, (void*)azErr[eCond], P4_STATIC);
  sqlite3ReleaseTempReg(pParse, regZero);
}